

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O3

void __thiscall GEO::geofile::rotate_Y(geofile *this,double *theta,point *in_point)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = sin(*theta);
  dVar3 = cos(*theta);
  dVar1 = in_point->x;
  in_point->x = dVar1 * dVar3 + dVar2 * in_point->z;
  in_point->z = in_point->z * dVar3 - dVar2 * dVar1;
  return;
}

Assistant:

void GEO::geofile::rotate_Y(const double &theta, point &in_point)
{
    double sin_theta = std::sin(theta);
    double cos_theta = std::cos(theta);
    double x = in_point.x * cos_theta + in_point.z * sin_theta;
    double z = in_point.z * cos_theta - in_point.x * sin_theta;
    in_point.x = x;
    in_point.z = z;
}